

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mie.cpp
# Opt level: O0

void __thiscall
OpenMD::Mie::getMieFunc(Mie *this,RealType *r,int *n,int *m,RealType *pot,RealType *deriv)

{
  double dVar1;
  int *in_RCX;
  int *in_RDX;
  double *in_RSI;
  double *in_R8;
  double *in_R9;
  __type_conflict _Var2;
  __type_conflict _Var3;
  RealType rim1;
  RealType rin1;
  RealType rim;
  RealType rin;
  RealType ri;
  undefined8 in_stack_ffffffffffffffa8;
  int __y;
  double in_stack_ffffffffffffffb0;
  
  dVar1 = *in_RSI;
  __y = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  _Var2 = std::pow<double,int>(in_stack_ffffffffffffffb0,__y);
  _Var3 = std::pow<double,int>(in_stack_ffffffffffffffb0,__y);
  *in_R8 = _Var2 - _Var3;
  *in_R9 = (double)-*in_RDX * _Var2 * (1.0 / dVar1) + (double)*in_RCX * _Var3 * (1.0 / dVar1);
  return;
}

Assistant:

void Mie::getMieFunc(const RealType& r, int& n, int& m, RealType& pot,
                       RealType& deriv) {
    RealType ri   = 1.0 / r;
    RealType rin  = pow(ri, n);
    RealType rim  = pow(ri, m);
    RealType rin1 = rin * ri;
    RealType rim1 = rim * ri;

    pot   = rin - rim;
    deriv = -n * rin1 + m * rim1;
    return;
  }